

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O0

bool __thiscall Memory::RecyclerSweepManager::DoPartialCollectMode(RecyclerSweepManager *this)

{
  RecyclerSweepManager *this_local;
  
  if ((this->recycler->enablePartialCollect & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if ((this->recycler->autoHeap).unusedPartialCollectFreeBytes < 0x1000001) {
    this_local._7_1_ = this->rescanRootBytes < 0x500001;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
RecyclerSweepManager::DoPartialCollectMode()
{
    if (!recycler->enablePartialCollect)
    {
        return false;
    }

    // If we exceed 16MB of unused memory in partial blocks, get out of partial collect to avoid
    // memory fragmentation.
    if (recycler->autoHeap.unusedPartialCollectFreeBytes > MaxUnusedPartialCollectFreeBytes)
    {
        return false;
    }

    return this->rescanRootBytes <= MaxPartialCollectRescanRootBytes;
}